

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O3

void cfl_pick_plane_rd(AV1_COMP *cpi,MACROBLOCK *x,int plane,TX_SIZE tx_size,int cfl_search_range,
                      RD_STATS *cfl_rd_arr,int est_best_cfl_idx)

{
  BLOCK_SIZE plane_bsize;
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  int cfl_idx;
  ulong uVar5;
  RD_STATS *rd_stats;
  
  plane_bsize = av1_ss_size_lookup[(*(x->e_mbd).mi)->bsize]
                [(x->e_mbd).plane[(uint)plane].subsampling_x]
                [(x->e_mbd).plane[(uint)plane].subsampling_y];
  lVar3 = 0x20;
  do {
    *(undefined8 *)((long)cfl_rd_arr + lVar3 + -0x20) = 0x7fffffff;
    *(undefined8 *)((long)cfl_rd_arr + lVar3 + -0x18) = 0x7fffffffffffffff;
    *(undefined8 *)((long)cfl_rd_arr + lVar3 + -0x10) = 0x7fffffffffffffff;
    *(undefined8 *)((long)cfl_rd_arr + lVar3 + -8) = 0x7fffffffffffffff;
    *(undefined1 *)((long)&cfl_rd_arr->rate + lVar3) = 0;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x548);
  cfl_compute_rd(cpi,x,plane,tx_size,plane_bsize,est_best_cfl_idx,0,cfl_rd_arr + est_best_cfl_idx);
  if (cfl_search_range != 1) {
    lVar3 = 0;
    bVar2 = true;
    do {
      bVar1 = bVar2;
      if (1 < cfl_search_range) {
        lVar4 = (long)cfl_dir_ls[lVar3];
        uVar5 = est_best_cfl_idx + lVar4;
        rd_stats = cfl_rd_arr + uVar5;
        lVar3 = (ulong)(uint)cfl_search_range - 1;
        do {
          if (0x20 < uVar5) break;
          cfl_compute_rd(cpi,x,plane,tx_size,plane_bsize,(int)uVar5,0,rd_stats);
          uVar5 = uVar5 + lVar4;
          rd_stats = rd_stats + lVar4;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
      lVar3 = 1;
      bVar2 = false;
    } while (bVar1);
  }
  return;
}

Assistant:

static void cfl_pick_plane_rd(const AV1_COMP *const cpi, MACROBLOCK *x,
                              int plane, TX_SIZE tx_size, int cfl_search_range,
                              RD_STATS cfl_rd_arr[CFL_MAGS_SIZE],
                              int est_best_cfl_idx) {
  assert(cfl_search_range >= 1 && cfl_search_range <= CFL_MAGS_SIZE);
  const MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->uv_mode == UV_CFL_PRED);
  const MACROBLOCKD_PLANE *pd = &xd->plane[plane];
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);

  for (int cfl_idx = 0; cfl_idx < CFL_MAGS_SIZE; ++cfl_idx) {
    av1_invalid_rd_stats(&cfl_rd_arr[cfl_idx]);
  }

  int fast_mode = 0;
  int start_cfl_idx = est_best_cfl_idx;
  cfl_compute_rd(cpi, x, plane, tx_size, plane_bsize, start_cfl_idx, fast_mode,
                 &cfl_rd_arr[start_cfl_idx]);

  if (cfl_search_range == 1) return;

  for (int si = 0; si < 2; ++si) {
    const int dir = cfl_dir_ls[si];
    for (int i = 1; i < cfl_search_range; ++i) {
      int cfl_idx = start_cfl_idx + dir * i;
      if (cfl_idx < 0 || cfl_idx >= CFL_MAGS_SIZE) break;
      cfl_compute_rd(cpi, x, plane, tx_size, plane_bsize, cfl_idx, fast_mode,
                     &cfl_rd_arr[cfl_idx]);
    }
  }
}